

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O0

void __thiscall
webfront::http::std::experimental::net::v1::detail::
scoped_ptr<std::experimental::net::v1::io_context>::~scoped_ptr
          (scoped_ptr<std::experimental::net::v1::io_context> *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    v1::io_context::~io_context((io_context *)0x119df6);
    operator_delete(pvVar1,0x10);
  }
  return;
}

Assistant:

~scoped_ptr()
  {
    delete p_;
  }